

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

PackageId __thiscall chatra::RuntimeImp::loadPackage(RuntimeImp *this,string *packageName)

{
  bool bVar1;
  pointer ppVar2;
  element_type *peVar3;
  PackageNotFoundException *this_00;
  pointer pPVar4;
  lock_guard<chatra::SpinLock> local_b8;
  lock_guard<chatra::SpinLock> lock;
  PackageId packageId;
  unique_ptr<chatra::Package,_std::default_delete<chatra::Package>_> local_a0;
  unique_ptr<chatra::Package,_std::default_delete<chatra::Package>_> package;
  PackageInfo p;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chatra::PackageId>,_true>
  local_50;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chatra::PackageId>,_true>
  local_48;
  iterator it;
  lock_guard<chatra::SpinLock> local_30;
  lock_guard<chatra::SpinLock> lock1;
  lock_guard<std::mutex> lock0;
  string *packageName_local;
  RuntimeImp *this_local;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&lock1,&this->mtLoadPackage);
  std::lock_guard<chatra::SpinLock>::lock_guard(&local_30,&this->lockPackages);
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chatra::PackageId,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chatra::PackageId>_>_>
       ::find(&this->packageIdByName,packageName);
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chatra::PackageId,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chatra::PackageId>_>_>
       ::end(&this->packageIdByName);
  bVar1 = std::__detail::operator!=(&local_48,&local_50);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chatra::PackageId>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chatra::PackageId>,_false,_true>
                           *)&local_48);
    this_local = (RuntimeImp *)ppVar2->second;
  }
  std::lock_guard<chatra::SpinLock>::~lock_guard(&local_30);
  if (!bVar1) {
    peVar3 = std::__shared_ptr_access<chatra::IHost,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chatra::IHost,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->host);
    (*peVar3->_vptr_IHost[3])(&package,peVar3,packageName);
    bVar1 = std::vector<chatra::Script,_std::allocator<chatra::Script>_>::empty
                      ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)&package);
    if (bVar1) {
      this_00 = (PackageNotFoundException *)__cxa_allocate_exception(0x28);
      (this_00->super_IllegalArgumentException).super_NativeException.message._M_string_length = 0;
      (this_00->super_IllegalArgumentException).super_NativeException.message.field_2.
      _M_allocated_capacity = 0;
      *(undefined8 *)&(this_00->super_IllegalArgumentException).super_NativeException = 0;
      *(undefined8 *)&(this_00->super_IllegalArgumentException).super_NativeException.message = 0;
      *(undefined8 *)
       ((long)&(this_00->super_IllegalArgumentException).super_NativeException.message.field_2 + 8)
           = 0;
      PackageNotFoundException::PackageNotFoundException(this_00);
      __cxa_throw(this_00,&PackageNotFoundException::typeinfo,
                  PackageNotFoundException::~PackageNotFoundException);
    }
    IdPool<chatra::PackageId,chatra::Package>::
    lockAndAllocate<chatra::RuntimeImp&,std::__cxx11::string_const&,chatra::PackageInfo,bool>
              ((IdPool<chatra::PackageId,chatra::Package> *)&local_a0,
               (RuntimeImp *)&this->packageIds,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (PackageInfo *)packageName,(bool *)&package);
    pPVar4 = std::unique_ptr<chatra::Package,_std::default_delete<chatra::Package>_>::operator->
                       (&local_a0);
    lock._M_device =
         (mutex_type *)
         IdType<chatra::PackageId,_chatra::Package>::getId
                   (&pPVar4->super_IdType<chatra::PackageId,_chatra::Package>);
    std::lock_guard<chatra::SpinLock>::lock_guard(&local_b8,&this->lockPackages);
    std::
    unordered_map<chatra::PackageId,std::unique_ptr<chatra::Package,std::default_delete<chatra::Package>>,std::hash<chatra::PackageId>,std::equal_to<chatra::PackageId>,std::allocator<std::pair<chatra::PackageId_const,std::unique_ptr<chatra::Package,std::default_delete<chatra::Package>>>>>
    ::
    emplace<chatra::PackageId&,std::unique_ptr<chatra::Package,std::default_delete<chatra::Package>>>
              ((unordered_map<chatra::PackageId,std::unique_ptr<chatra::Package,std::default_delete<chatra::Package>>,std::hash<chatra::PackageId>,std::equal_to<chatra::PackageId>,std::allocator<std::pair<chatra::PackageId_const,std::unique_ptr<chatra::Package,std::default_delete<chatra::Package>>>>>
                *)&this->packages,(PackageId *)&lock,&local_a0);
    std::
    unordered_map<std::__cxx11::string,chatra::PackageId,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chatra::PackageId>>>
    ::emplace<std::__cxx11::string_const&,chatra::PackageId&>
              ((unordered_map<std::__cxx11::string,chatra::PackageId,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chatra::PackageId>>>
                *)&this->packageIdByName,packageName,(PackageId *)&lock);
    this_local = (RuntimeImp *)lock._M_device;
    std::lock_guard<chatra::SpinLock>::~lock_guard(&local_b8);
    std::unique_ptr<chatra::Package,_std::default_delete<chatra::Package>_>::~unique_ptr(&local_a0);
    PackageInfo::~PackageInfo((PackageInfo *)&package);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&lock1);
  return (PackageId)this_local;
}

Assistant:

PackageId RuntimeImp::loadPackage(const std::string& packageName) {
	std::lock_guard<std::mutex> lock0(mtLoadPackage);
	{
		std::lock_guard<SpinLock> lock1(lockPackages);
		auto it = packageIdByName.find(packageName);
		if (it != packageIdByName.end())
			return it->second;
	}
	auto p = host->queryPackage(packageName);
	if (p.scripts.empty())
		throw PackageNotFoundException();

	auto package = packageIds.lockAndAllocate(*this, packageName, std::move(p), true);
	auto packageId = package->getId();

	std::lock_guard<SpinLock> lock(lockPackages);
	packages.emplace(packageId, std::move(package));
	packageIdByName.emplace(packageName, packageId);
	return packageId;
}